

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCalculator.cpp
# Opt level: O2

vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_> *
__thiscall
tiger::trains::ai::PathCalculator::getMinPath
          (vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
           *__return_storage_ptr__,PathCalculator *this,Point *point)

{
  mapped_type *ppPVar1;
  map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
  *this_00;
  Point *temp_point;
  mapped_type local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->ancestors;
  local_20 = point;
  ppPVar1 = std::
            map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
            ::operator[](this_00,&local_20);
  if (*ppPVar1 != (mapped_type)0x0) {
    while( true ) {
      ppPVar1 = std::
                map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
                ::operator[](this_00,&local_20);
      if (*ppPVar1 == local_20) break;
      std::
      vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
      ::push_back(__return_storage_ptr__,&local_20);
      ppPVar1 = std::
                map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
                ::operator[](this_00,&local_20);
      local_20 = *ppPVar1;
    }
    std::
    vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
    ::push_back(__return_storage_ptr__,&local_20);
    std::
    __reverse<__gnu_cxx::__normal_iterator<tiger::trains::world::Point_const**,std::vector<tiger::trains::world::Point_const*,std::allocator<tiger::trains::world::Point_const*>>>>
              ((__return_storage_ptr__->
               super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const world::Point *> PathCalculator::getMinPath(const world::Point *point)
{
    std::vector<const world::Point *> vec;
    const world::Point *temp_point=point;

    if (ancestors[temp_point] == nullptr)
        return vec;

    while (ancestors[temp_point] != temp_point)
    {
        vec.push_back(temp_point);
        temp_point = ancestors[temp_point];
    }

    vec.push_back(temp_point);
    std::reverse(vec.begin(), vec.end());

    return vec;
}